

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinSubstr
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  pointer pcVar1;
  pointer pVVar2;
  ulong uVar3;
  anon_union_8_3_4e909c26_for_v aVar4;
  RuntimeError *pRVar5;
  allocator_type *in_RCX;
  size_type __n;
  size_type sVar6;
  ulong __pos;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  Value VVar7;
  stringstream ss;
  string local_1f0;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_1d0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  local_1a8 [23];
  
  pcVar1 = (pointer)(local_1b8 + 0x10);
  local_1b8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"substr","");
  local_1f0._M_dataplus._M_p = (pointer)0x200000013;
  local_1f0._M_string_length._0_4_ = 2;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_1f0;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector(&local_1d0,__l,in_RCX);
  validateBuiltinArgs(this,loc,(string *)local_1b8,args,&local_1d0);
  if (local_1d0.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d0.
                    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1d0.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d0.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_1b8._0_8_ != pcVar1) {
    operator_delete((void *)local_1b8._0_8_,
                    CONCAT44(local_1a8[0]._M_local_buf[1],local_1a8[0]._M_local_buf[0]) + 1);
  }
  pVVar2 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __pos = (ulong)pVVar2[1].v.d;
  if (-1 < (long)__pos) {
    sVar6 = (size_type)pVVar2[2].v.d;
    if (-1 < (long)sVar6) {
      uVar3 = *(ulong *)&(pVVar2->v).h[1].mark;
      if (uVar3 < __pos) {
        local_1b8._8_8_ = 0;
        local_1a8[0]._M_local_buf[0] = L'\0';
        local_1b8._0_8_ = pcVar1;
        VVar7 = makeString(this,(UString *)local_1b8);
        aVar4 = VVar7._0_8_;
      }
      else {
        __n = uVar3 - __pos;
        if (sVar6 + __pos <= uVar3) {
          __n = sVar6;
        }
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::substr((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 local_1b8,
                 (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 ((pVVar2->v).h + 1),__pos,__n);
        VVar7 = makeString(this,(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                 *)local_1b8);
        aVar4 = VVar7._0_8_;
      }
      (this->scratch).t = STRING;
      (this->scratch).v = aVar4;
      if ((pointer)local_1b8._0_8_ != pcVar1) {
        operator_delete((void *)local_1b8._0_8_,
                        CONCAT44(local_1a8[0]._M_local_buf[1],local_1a8[0]._M_local_buf[0]) * 4 + 4)
        ;
      }
      return (AST *)0x0;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),
               "substr third parameter should be greater than zero, got ",0x38);
    std::ostream::_M_insert<long>((long)(local_1b8 + 0x10));
    pRVar5 = (RuntimeError *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    Stack::makeError(pRVar5,&this->stack,loc,&local_1f0);
    __cxa_throw(pRVar5,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b8 + 0x10),
             "substr second parameter should be greater than zero, got ",0x39);
  std::ostream::_M_insert<long>((long)(local_1b8 + 0x10));
  pRVar5 = (RuntimeError *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  Stack::makeError(pRVar5,&this->stack,loc,&local_1f0);
  __cxa_throw(pRVar5,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

const AST *builtinSubstr(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "substr", args, {Value::STRING, Value::NUMBER, Value::NUMBER});
        const auto *str = static_cast<const HeapString *>(args[0].v.h);
        long from = long(args[1].v.d);
        long len = long(args[2].v.d);
        if (from < 0) {
            std::stringstream ss;
            ss << "substr second parameter should be greater than zero, got " << from;
            throw makeError(loc, ss.str());
        }
        if (len < 0) {
            std::stringstream ss;
            ss << "substr third parameter should be greater than zero, got " << len;
            throw makeError(loc, ss.str());
        }
        if (static_cast<unsigned long>(from) > str->value.size()) {
            scratch = makeString(UString());
            return nullptr;
        }
        if (size_t(len + from) > str->value.size()) {
          len = str->value.size() - from;
        }
        scratch = makeString(str->value.substr(from, len));
        return nullptr;
    }